

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmJSONHelpers.cxx
# Opt level: O2

void JsonErrors::INVALID_INT(Value *value,cmJSONState *state)

{
  allocator<char> local_59;
  ErrorGenerator local_58;
  string local_38;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"an integer",&local_59);
  EXPECTED_TYPE(&local_58,&local_38);
  std::function<void_(const_Json::Value_*,_cmJSONState_*)>::operator()(&local_58,value,state);
  std::_Function_base::~_Function_base(&local_58.super__Function_base);
  std::__cxx11::string::~string((string *)&local_38);
  return;
}

Assistant:

void INVALID_INT(const Json::Value* value, cmJSONState* state)
{
  JsonErrors::EXPECTED_TYPE("an integer")(value, state);
}